

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O1

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  int iVar34;
  undefined1 auVar32 [16];
  void *local_108;
  void *local_100;
  Mat local_e8;
  ulong local_a0;
  Mat local_98;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar1 = bottom_top_blob->dims;
  sVar2 = bottom_top_blob->elemsize;
  iVar17 = this->axis;
  if (uVar1 == 1) {
    iVar33 = bottom_top_blob->w;
    lVar18 = (long)iVar33;
    pvVar11 = bottom_top_blob->data;
    auVar25._0_12_ = ZEXT812(0xff7fffff);
    auVar25._12_4_ = 0;
    if (0 < lVar18) {
      lVar6 = 0;
      do {
        fVar28 = *(float *)((long)pvVar11 + lVar6 * 4);
        if (auVar25._0_4_ <= fVar28) {
          auVar25._0_4_ = fVar28;
        }
        lVar6 = lVar6 + 1;
      } while (lVar18 != lVar6);
    }
    fVar28 = 0.0;
    if (0 < iVar33) {
      lVar6 = 0;
      uVar24 = auVar25._0_4_;
      do {
        fVar21 = expf(*(float *)((long)pvVar11 + lVar6 * 4) - auVar25._0_4_);
        auVar25 = ZEXT416(uVar24);
        *(float *)((long)pvVar11 + lVar6 * 4) = fVar21;
        fVar28 = fVar28 + fVar21;
        lVar6 = lVar6 + 1;
      } while (lVar18 != lVar6);
    }
    if (0 < iVar33) {
      lVar6 = 0;
      do {
        *(float *)((long)pvVar11 + lVar6 * 4) =
             *(float *)((long)pvVar11 + lVar6 * 4) * (1.0 / fVar28);
        lVar6 = lVar6 + 1;
      } while (lVar18 != lVar6);
    }
  }
  iVar17 = (iVar17 >> 0x1f & uVar1) + iVar17;
  if ((uVar1 == 2) && (iVar17 == 0)) {
    uVar24 = bottom_top_blob->w;
    uVar14 = (ulong)uVar24;
    uVar10 = bottom_top_blob->h;
    uVar8 = (ulong)uVar10;
    local_e8.cstep = 0;
    local_e8.data = (void *)0x0;
    local_e8.refcount._0_4_ = 0;
    local_e8.refcount._4_4_ = 0;
    local_e8.elemsize._0_4_ = 0;
    local_e8.elemsize._4_4_ = 0;
    local_e8.elempack = 0;
    local_e8.allocator = (Allocator *)0x0;
    local_e8.dims = 0;
    local_e8.w = 0;
    local_e8.h = 0;
    local_e8.d = 0;
    local_e8.c = 0;
    Mat::create(&local_e8,uVar24,sVar2,opt->workspace_allocator);
    auVar27 = _DAT_00595130;
    auVar26 = _DAT_00595120;
    auVar25 = _DAT_00595020;
    if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
      uVar9 = local_e8.c * (int)local_e8.cstep;
      if (0 < (int)uVar9) {
        lVar18 = (ulong)uVar9 - 1;
        auVar22._8_4_ = (int)lVar18;
        auVar22._0_8_ = lVar18;
        auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar12 = 0;
        auVar22 = auVar22 ^ _DAT_00595020;
        do {
          auVar29._8_4_ = (int)uVar12;
          auVar29._0_8_ = uVar12;
          auVar29._12_4_ = (int)(uVar12 >> 0x20);
          auVar32 = (auVar29 | auVar27) ^ auVar25;
          iVar17 = auVar22._4_4_;
          if ((bool)(~(iVar17 < auVar32._4_4_ ||
                      auVar22._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar17) & 1)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4) = 0xff7fffff;
          }
          if (auVar32._12_4_ <= auVar22._12_4_ &&
              (auVar32._8_4_ <= auVar22._8_4_ || auVar32._12_4_ != auVar22._12_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 4) = 0xff7fffff;
          }
          auVar29 = (auVar29 | auVar26) ^ auVar25;
          iVar33 = auVar29._4_4_;
          if (iVar33 <= iVar17 && (iVar33 != iVar17 || auVar29._0_4_ <= auVar22._0_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 8) = 0xff7fffff;
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 0xc) = 0xff7fffff;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar9 + 3 & 0xfffffffc) != uVar12);
      }
      if (0 < (int)uVar10) {
        pvVar11 = bottom_top_blob->data;
        iVar17 = bottom_top_blob->w;
        sVar3 = bottom_top_blob->elemsize;
        uVar12 = 0;
        do {
          if (0 < (int)uVar24) {
            uVar15 = 0;
            do {
              fVar21 = *(float *)((long)pvVar11 + uVar15 * 4);
              fVar28 = *(float *)((long)local_e8.data + uVar15 * 4);
              if (fVar21 <= fVar28) {
                fVar21 = fVar28;
              }
              *(float *)((long)local_e8.data + uVar15 * 4) = fVar21;
              uVar15 = uVar15 + 1;
            } while (uVar14 != uVar15);
          }
          uVar12 = uVar12 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar17 * sVar3);
        } while (uVar12 != uVar8);
      }
      local_a0 = local_a0 & 0xffffffff00000000;
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,uVar24,sVar2,opt->workspace_allocator);
      pvVar11 = local_98.data;
      bVar19 = local_98.data == (void *)0x0;
      bVar20 = (long)local_98.c * local_98.cstep == 0;
      if (!bVar19 && !bVar20) {
        if (0 < local_98.c * (int)local_98.cstep) {
          memset(local_98.data,0,(ulong)(uint)(local_98.c * (int)local_98.cstep) << 2);
        }
        pvVar7 = local_e8.data;
        if (0 < (int)uVar10) {
          pvVar13 = bottom_top_blob->data;
          iVar17 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar12 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar15 = 0;
              do {
                fVar28 = expf(*(float *)((long)pvVar13 + uVar15 * 4) -
                              *(float *)((long)pvVar7 + uVar15 * 4));
                *(float *)((long)pvVar13 + uVar15 * 4) = fVar28;
                *(float *)((long)pvVar11 + uVar15 * 4) =
                     fVar28 + *(float *)((long)pvVar11 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar12 = uVar12 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)iVar17 * sVar3);
          } while (uVar12 != uVar8);
        }
        if (0 < (int)uVar10) {
          pvVar7 = bottom_top_blob->data;
          iVar17 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar12 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar15 = 0;
              do {
                *(float *)((long)pvVar7 + uVar15 * 4) =
                     *(float *)((long)pvVar7 + uVar15 * 4) / *(float *)((long)pvVar11 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar12 = uVar12 + 1;
            pvVar7 = (void *)((long)pvVar7 + (long)iVar17 * sVar3);
          } while (uVar12 != uVar8);
        }
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      iVar17 = (int)local_a0;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      if (bVar19 || bVar20) {
        return -100;
      }
      goto LAB_00358106;
    }
    piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) goto LAB_00358926;
      if (local_e8.allocator != (Allocator *)0x0) {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
        goto LAB_00358926;
      }
LAB_00358919:
      if (local_e8.data != (void *)0x0) {
        free(local_e8.data);
      }
    }
LAB_00358926:
    iVar33 = -100;
  }
  else {
LAB_00358106:
    local_a0 = CONCAT44(local_a0._4_4_,iVar17);
    if (((uVar1 == 2) && (iVar17 == 1)) && (iVar17 = bottom_top_blob->h, 0 < (long)iVar17)) {
      uVar24 = bottom_top_blob->w;
      pvVar11 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      uVar14 = (ulong)uVar24;
      lVar18 = 0;
      do {
        auVar26._0_12_ = ZEXT812(0xff7fffff);
        auVar26._12_4_ = 0;
        if (0 < (int)uVar24) {
          uVar8 = 0;
          auVar26._0_12_ = ZEXT812(0xff7fffff);
          auVar26._12_4_ = 0;
          do {
            fVar28 = *(float *)((long)pvVar11 + uVar8 * 4);
            if (auVar26._0_4_ <= fVar28) {
              auVar26._0_4_ = fVar28;
            }
            uVar8 = uVar8 + 1;
          } while (uVar14 != uVar8);
        }
        fVar28 = 0.0;
        if (0 < (int)uVar24) {
          uVar8 = 0;
          uVar10 = auVar26._0_4_;
          do {
            fVar21 = expf(*(float *)((long)pvVar11 + uVar8 * 4) - auVar26._0_4_);
            auVar26 = ZEXT416(uVar10);
            *(float *)((long)pvVar11 + uVar8 * 4) = fVar21;
            fVar28 = fVar28 + fVar21;
            uVar8 = uVar8 + 1;
          } while (uVar14 != uVar8);
        }
        if (0 < (int)uVar24) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar11 + uVar8 * 4) =
                 *(float *)((long)pvVar11 + uVar8 * 4) * (1.0 / fVar28);
            uVar8 = uVar8 + 1;
          } while (uVar14 != uVar8);
        }
        lVar18 = lVar18 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar24 * sVar3);
      } while (lVar18 != iVar17);
    }
    iVar17 = (int)local_a0;
    if ((uVar1 == 3) && ((int)local_a0 == 0)) {
      iVar17 = bottom_top_blob->w;
      iVar33 = bottom_top_blob->h;
      uVar24 = bottom_top_blob->c;
      uVar14 = (ulong)uVar24;
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.allocator = (Allocator *)0x0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      Mat::create(&local_e8,iVar17,iVar33,sVar2,opt->workspace_allocator);
      auVar27 = _DAT_00595130;
      auVar26 = _DAT_00595120;
      auVar25 = _DAT_00595020;
      if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) goto LAB_00358919;
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00358926;
      }
      uVar9 = iVar33 * iVar17;
      uVar8 = (ulong)uVar9;
      uVar10 = local_e8.c * (int)local_e8.cstep;
      if (0 < (int)uVar10) {
        lVar18 = (ulong)uVar10 - 1;
        auVar32._8_4_ = (int)lVar18;
        auVar32._0_8_ = lVar18;
        auVar32._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar12 = 0;
        auVar32 = auVar32 ^ _DAT_00595020;
        do {
          auVar30._8_4_ = (int)uVar12;
          auVar30._0_8_ = uVar12;
          auVar30._12_4_ = (int)(uVar12 >> 0x20);
          auVar22 = (auVar30 | auVar27) ^ auVar25;
          iVar16 = auVar32._4_4_;
          if ((bool)(~(iVar16 < auVar22._4_4_ ||
                      auVar32._0_4_ < auVar22._0_4_ && auVar22._4_4_ == iVar16) & 1)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4) = 0xff7fffff;
          }
          if (auVar22._12_4_ <= auVar32._12_4_ &&
              (auVar22._8_4_ <= auVar32._8_4_ || auVar22._12_4_ != auVar32._12_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 4) = 0xff7fffff;
          }
          auVar22 = (auVar30 | auVar26) ^ auVar25;
          iVar34 = auVar22._4_4_;
          if (iVar34 <= iVar16 && (iVar34 != iVar16 || auVar22._0_4_ <= auVar32._0_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 8) = 0xff7fffff;
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 0xc) = 0xff7fffff;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar10 + 3 & 0xfffffffc) != uVar12);
      }
      if (0 < (int)uVar24) {
        pvVar11 = bottom_top_blob->data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        uVar12 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar15 = 0;
            do {
              fVar21 = *(float *)((long)pvVar11 + uVar15 * 4);
              fVar28 = *(float *)((long)local_e8.data + uVar15 * 4);
              if (fVar21 <= fVar28) {
                fVar21 = fVar28;
              }
              *(float *)((long)local_e8.data + uVar15 * 4) = fVar21;
              uVar15 = uVar15 + 1;
            } while (uVar8 != uVar15);
          }
          uVar12 = uVar12 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
        } while (uVar12 != uVar14);
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,iVar17,iVar33,sVar2,opt->workspace_allocator);
      bVar19 = (long)local_98.c * local_98.cstep == 0;
      local_50 = CONCAT71(local_50._1_7_,local_98.data == (void *)0x0 || bVar19);
      if (local_98.data != (void *)0x0 && !bVar19) {
        if (0 < local_98.c * (int)local_98.cstep) {
          memset(local_98.data,0,(ulong)(uint)(local_98.c * (int)local_98.cstep) << 2);
        }
        pvVar7 = local_98.data;
        pvVar11 = local_e8.data;
        if (0 < (int)uVar24) {
          sVar3 = bottom_top_blob->cstep;
          sVar4 = bottom_top_blob->elemsize;
          pvVar13 = bottom_top_blob->data;
          uVar12 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar15 = 0;
              do {
                fVar28 = expf(*(float *)((long)pvVar13 + uVar15 * 4) -
                              *(float *)((long)pvVar11 + uVar15 * 4));
                *(float *)((long)pvVar13 + uVar15 * 4) = fVar28;
                *(float *)((long)pvVar7 + uVar15 * 4) =
                     fVar28 + *(float *)((long)pvVar7 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            uVar12 = uVar12 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
          } while (uVar12 != uVar14);
        }
        if (0 < (int)uVar24) {
          pvVar11 = bottom_top_blob->data;
          sVar3 = bottom_top_blob->cstep;
          sVar4 = bottom_top_blob->elemsize;
          uVar12 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar15 = 0;
              do {
                *(float *)((long)pvVar11 + uVar15 * 4) =
                     *(float *)((long)pvVar11 + uVar15 * 4) /
                     *(float *)((long)local_98.data + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            uVar12 = uVar12 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
          } while (uVar12 != uVar14);
        }
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      iVar17 = (int)local_a0;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      if ((char)local_50 != '\0') {
        return -100;
      }
    }
    if ((uVar1 == 3) && (iVar17 == 1)) {
      uVar24 = bottom_top_blob->w;
      uVar14 = (ulong)uVar24;
      iVar33 = bottom_top_blob->h;
      uVar10 = bottom_top_blob->c;
      uVar8 = (ulong)uVar10;
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.allocator = (Allocator *)0x0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      Mat::create(&local_e8,uVar24,uVar10,sVar2,opt->workspace_allocator);
      auVar27 = _DAT_00595130;
      auVar26 = _DAT_00595120;
      auVar25 = _DAT_00595020;
      if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) goto LAB_00358919;
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00358926;
      }
      lVar18 = (long)(int)uVar24;
      uVar9 = local_e8.c * (int)local_e8.cstep;
      if (0 < (int)uVar9) {
        lVar6 = (ulong)uVar9 - 1;
        auVar23._8_4_ = (int)lVar6;
        auVar23._0_8_ = lVar6;
        auVar23._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar12 = 0;
        auVar23 = auVar23 ^ _DAT_00595020;
        do {
          auVar31._8_4_ = (int)uVar12;
          auVar31._0_8_ = uVar12;
          auVar31._12_4_ = (int)(uVar12 >> 0x20);
          auVar22 = (auVar31 | auVar27) ^ auVar25;
          iVar16 = auVar23._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar16 && auVar23._0_4_ < auVar22._0_4_ ||
                      iVar16 < auVar22._4_4_) & 1)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4) = 0xff7fffff;
          }
          if ((auVar22._12_4_ != auVar23._12_4_ || auVar22._8_4_ <= auVar23._8_4_) &&
              auVar22._12_4_ <= auVar23._12_4_) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 4) = 0xff7fffff;
          }
          auVar22 = (auVar31 | auVar26) ^ auVar25;
          iVar34 = auVar22._4_4_;
          if (iVar34 <= iVar16 && (iVar34 != iVar16 || auVar22._0_4_ <= auVar23._0_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 8) = 0xff7fffff;
            *(undefined4 *)((long)local_e8.data + uVar12 * 4 + 0xc) = 0xff7fffff;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar9 + 3 & 0xfffffffc) != uVar12);
      }
      if (0 < (int)uVar10) {
        pvVar11 = bottom_top_blob->data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        uVar12 = 0;
        pvVar7 = local_e8.data;
        do {
          if (0 < iVar33) {
            iVar16 = 0;
            pvVar13 = pvVar11;
            do {
              if (0 < (int)uVar24) {
                uVar15 = 0;
                do {
                  fVar21 = *(float *)((long)pvVar13 + uVar15 * 4);
                  fVar28 = *(float *)((long)pvVar7 + uVar15 * 4);
                  if (fVar21 <= fVar28) {
                    fVar21 = fVar28;
                  }
                  *(float *)((long)pvVar7 + uVar15 * 4) = fVar21;
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              iVar16 = iVar16 + 1;
              pvVar13 = (void *)((long)pvVar13 + lVar18 * 4);
            } while (iVar16 != iVar33);
          }
          uVar12 = uVar12 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
          pvVar7 = (void *)((long)pvVar7 +
                           (long)local_e8.w *
                           CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar12 != uVar8);
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,uVar24,uVar10,sVar2,opt->workspace_allocator);
      bVar19 = local_98.data == (void *)0x0;
      bVar20 = (long)local_98.c * local_98.cstep == 0;
      if (!bVar19 && !bVar20) {
        if (0 < local_98.c * (int)local_98.cstep) {
          memset(local_98.data,0,(ulong)(uint)(local_98.c * (int)local_98.cstep) << 2);
        }
        local_50 = uVar8;
        if (0 < (int)uVar10) {
          local_108 = bottom_top_blob->data;
          local_48 = (long)local_98.w *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
          local_40 = (long)local_e8.w *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
          local_38 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
          uVar8 = 0;
          pvVar11 = local_98.data;
          pvVar7 = local_e8.data;
          do {
            if (0 < iVar33) {
              iVar17 = 0;
              pvVar13 = local_108;
              do {
                if (0 < (int)uVar24) {
                  uVar12 = 0;
                  do {
                    fVar28 = expf(*(float *)((long)pvVar13 + uVar12 * 4) -
                                  *(float *)((long)pvVar7 + uVar12 * 4));
                    *(float *)((long)pvVar13 + uVar12 * 4) = fVar28;
                    *(float *)((long)pvVar11 + uVar12 * 4) =
                         fVar28 + *(float *)((long)pvVar11 + uVar12 * 4);
                    uVar12 = uVar12 + 1;
                  } while (uVar14 != uVar12);
                }
                iVar17 = iVar17 + 1;
                pvVar13 = (void *)((long)pvVar13 + lVar18 * 4);
              } while (iVar17 != iVar33);
            }
            uVar8 = uVar8 + 1;
            pvVar11 = (void *)((long)pvVar11 + local_48);
            pvVar7 = (void *)((long)pvVar7 + local_40);
            local_108 = (void *)((long)local_108 + local_38);
          } while (uVar8 != local_50);
        }
        iVar17 = (int)local_a0;
        if (0 < (int)local_50) {
          pvVar11 = bottom_top_blob->data;
          sVar2 = bottom_top_blob->cstep;
          sVar3 = bottom_top_blob->elemsize;
          uVar8 = 0;
          pvVar7 = local_98.data;
          do {
            if (0 < iVar33) {
              iVar16 = 0;
              pvVar13 = pvVar11;
              do {
                if (0 < (int)uVar24) {
                  uVar12 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar12 * 4) =
                         *(float *)((long)pvVar13 + uVar12 * 4) /
                         *(float *)((long)pvVar7 + uVar12 * 4);
                    uVar12 = uVar12 + 1;
                  } while (uVar14 != uVar12);
                }
                iVar16 = iVar16 + 1;
                pvVar13 = (void *)((long)pvVar13 + lVar18 * 4);
              } while (iVar16 != iVar33);
            }
            uVar8 = uVar8 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
            pvVar7 = (void *)((long)pvVar7 +
                             (long)local_98.w *
                             CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
          } while (uVar8 != local_50);
        }
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      if (bVar19 || bVar20) {
        return -100;
      }
    }
    iVar33 = 0;
    if (((uVar1 == 3) && (iVar17 == 2)) && (iVar17 = bottom_top_blob->c, 0 < (long)iVar17)) {
      uVar1 = bottom_top_blob->w;
      uVar14 = (ulong)uVar1;
      iVar33 = bottom_top_blob->h;
      local_100 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      lVar18 = 0;
      do {
        if (0 < iVar33) {
          iVar16 = 0;
          pvVar11 = local_100;
          do {
            auVar27._0_12_ = ZEXT812(0xff7fffff);
            auVar27._12_4_ = 0;
            if (0 < (int)uVar1) {
              uVar8 = 0;
              auVar27._0_12_ = ZEXT812(0xff7fffff);
              auVar27._12_4_ = 0;
              do {
                fVar28 = *(float *)((long)pvVar11 + uVar8 * 4);
                if (auVar27._0_4_ <= fVar28) {
                  auVar27._0_4_ = fVar28;
                }
                uVar8 = uVar8 + 1;
              } while (uVar14 != uVar8);
            }
            fVar28 = 0.0;
            if (0 < (int)uVar1) {
              uVar8 = 0;
              uVar24 = auVar27._0_4_;
              do {
                fVar21 = expf(*(float *)((long)pvVar11 + uVar8 * 4) - auVar27._0_4_);
                auVar27 = ZEXT416(uVar24);
                *(float *)((long)pvVar11 + uVar8 * 4) = fVar21;
                fVar28 = fVar28 + fVar21;
                uVar8 = uVar8 + 1;
              } while (uVar14 != uVar8);
            }
            if (0 < (int)uVar1) {
              uVar8 = 0;
              do {
                *(float *)((long)pvVar11 + uVar8 * 4) =
                     *(float *)((long)pvVar11 + uVar8 * 4) * (1.0 / fVar28);
                uVar8 = uVar8 + 1;
              } while (uVar14 != uVar8);
            }
            iVar16 = iVar16 + 1;
            pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar1 * 4);
          } while (iVar16 != iVar33);
        }
        lVar18 = lVar18 + 1;
        local_100 = (void *)((long)local_100 + local_a0);
      } while (lVar18 != iVar17);
      iVar33 = 0;
    }
  }
  return iVar33;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = expf(ptr[i] - max);
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = expf(ptr[j] - max[j]);
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = expf(ptr[j] - m);
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = expf(ptr[i] - max[i]);
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = expf(ptr[j] - maxptr[j]);
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = expf(ptr[j] - max);
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }
    }

    return 0;
}